

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O3

CustomAttribute
winmd::reader::get_attribute<winmd::reader::InterfaceImpl>
          (InterfaceImpl *row,string_view *type_namespace,string_view *type_name)

{
  undefined8 uVar1;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  CustomAttribute CVar5;
  CustomAttribute __begin0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  pair;
  CustomAttribute local_88;
  undefined1 local_70 [32];
  pair<winmd::reader::CustomAttribute,_winmd::reader::CustomAttribute> local_50;
  
  local_70._0_8_ = (row->super_row_base<winmd::reader::InterfaceImpl>).m_table;
  local_70._8_4_ = (row->super_row_base<winmd::reader::InterfaceImpl>).m_index * 0x20 + 0x25;
  equal_range<winmd::reader::table<winmd::reader::CustomAttribute>,winmd::reader::coded_index<winmd::reader::HasCustomAttribute>>
            (&local_50,
             (reader *)
             &((((database *)local_70._0_8_)->TypeRef).super_table_base.m_database)->CustomAttribute
             ,(table<winmd::reader::CustomAttribute> *)local_70,
             (coded_index<winmd::reader::HasCustomAttribute> *)(ulong)(uint)local_70._8_4_);
  local_88.super_row_base<winmd::reader::CustomAttribute>.m_table =
       local_50.first.super_row_base<winmd::reader::CustomAttribute>.m_table;
  local_88.super_row_base<winmd::reader::CustomAttribute>.m_index =
       local_50.first.super_row_base<winmd::reader::CustomAttribute>.m_index;
  local_88.super_row_base<winmd::reader::CustomAttribute>._12_4_ =
       local_50.first.super_row_base<winmd::reader::CustomAttribute>._12_4_;
  uVar1 = local_88.super_row_base<winmd::reader::CustomAttribute>._8_8_;
  if ((local_50.first.super_row_base<winmd::reader::CustomAttribute>.m_table !=
       local_50.second.super_row_base<winmd::reader::CustomAttribute>.m_table) ||
     (local_88.super_row_base<winmd::reader::CustomAttribute>.m_index =
           local_50.first.super_row_base<winmd::reader::CustomAttribute>.m_index,
     local_88.super_row_base<winmd::reader::CustomAttribute>.m_index !=
     local_50.second.super_row_base<winmd::reader::CustomAttribute>.m_index)) {
    local_88.super_row_base<winmd::reader::CustomAttribute>._8_8_ = uVar1;
    do {
      CustomAttribute::TypeNamespaceAndName
                ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *)local_70,&local_88);
      if ((database *)local_70._0_8_ == (database *)type_namespace->_M_len) {
        if ((database *)local_70._0_8_ != (database *)0x0) {
          iVar2 = bcmp((void *)CONCAT44(local_70._12_4_,local_70._8_4_),type_namespace->_M_str,
                       local_70._0_8_);
          if (iVar2 != 0) goto LAB_0014ddf2;
        }
        if (local_70._16_8_ == type_name->_M_len) {
          if (local_70._16_8_ != 0) {
            iVar2 = bcmp((void *)local_70._24_8_,type_name->_M_str,local_70._16_8_);
            if (iVar2 != 0) goto LAB_0014ddf2;
          }
          uVar4 = local_88.super_row_base<winmd::reader::CustomAttribute>._8_8_ & 0xffffffff;
          goto LAB_0014de10;
        }
      }
LAB_0014ddf2:
      uVar3 = local_88.super_row_base<winmd::reader::CustomAttribute>.m_index + 1;
      local_88.super_row_base<winmd::reader::CustomAttribute>.m_index = uVar3;
    } while (uVar3 != local_50.second.super_row_base<winmd::reader::CustomAttribute>.m_index ||
             local_88.super_row_base<winmd::reader::CustomAttribute>.m_table !=
             local_50.second.super_row_base<winmd::reader::CustomAttribute>.m_table);
  }
  uVar4 = 0;
  local_88.super_row_base<winmd::reader::CustomAttribute>.m_table = (table_base *)0x0;
LAB_0014de10:
  CVar5.super_row_base<winmd::reader::CustomAttribute>._8_8_ = uVar4;
  CVar5.super_row_base<winmd::reader::CustomAttribute>.m_table =
       local_88.super_row_base<winmd::reader::CustomAttribute>.m_table;
  return (CustomAttribute)CVar5.super_row_base<winmd::reader::CustomAttribute>;
}

Assistant:

CustomAttribute get_attribute(T const& row, std::string_view const& type_namespace, std::string_view const& type_name)
    {
        for (auto&& attribute : row.CustomAttribute())
        {
            auto pair = attribute.TypeNamespaceAndName();

            if (pair.first == type_namespace && pair.second == type_name)
            {
                return attribute;
            }
        }

        return {};
    }